

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O1

void hash_final(permutation_fptr permutation,ascon_hash_ctx_t *ctx,uint8_t *digest,size_t digest_len
               )

{
  uint_fast8_t i;
  uint64_t uVar1;
  long lVar2;
  
  uVar1 = bigendian_decode_varlen(ctx->buffer,ctx->buffer_len);
  (ctx->sponge).x0 =
       0x80L << ((ulong)(byte)(ctx->buffer_len * -8 + 0x38) & 0x3f) ^ uVar1 ^ (ctx->sponge).x0;
  ascon_permutation_12(&ctx->sponge);
  if (8 < digest_len) {
    do {
      bigendian_encode_u64(digest,(ctx->sponge).x0);
      (*permutation)(&ctx->sponge);
      digest_len = digest_len - 8;
      digest = digest + 8;
    } while (8 < digest_len);
  }
  bigendian_encode_varlen(digest,(ctx->sponge).x0,(uint_fast8_t)digest_len);
  lVar2 = 0;
  (ctx->sponge).x0 = 0;
  (ctx->sponge).x1 = 0;
  (ctx->sponge).x2 = 0;
  (ctx->sponge).x3 = 0;
  (ctx->sponge).x4 = 0;
  do {
    ctx->buffer[lVar2] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  ctx->buffer_len = '\0';
  ctx->flow_state = '\0';
  lVar2 = -6;
  do {
    ctx[1].buffer[lVar2 + -0x28] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

static void
hash_final(permutation_fptr permutation,
           ascon_hash_ctx_t* const ctx,
           uint8_t* digest,
           size_t digest_len)
{
    // If there is any remaining less-than-a-block data to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->sponge.x0 ^= bigendian_decode_varlen(ctx->buffer, ctx->buffer_len);
    ctx->sponge.x0 ^= PADDING(ctx->buffer_len);
    ascon_permutation_12(&ctx->sponge);
    // Squeeze the digest from the inner state.
    while (digest_len > ASCON_RATE)
    {
        bigendian_encode_u64(digest, ctx->sponge.x0);
        permutation(&ctx->sponge);
        digest_len -= ASCON_RATE;
        digest += ASCON_RATE;
    }
    bigendian_encode_varlen(digest, ctx->sponge.x0, (uint_fast8_t) digest_len);
    // Final security cleanup of the internal state and buffer.
    ascon_hash_cleanup(ctx);
}